

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall inject::no_binding::~no_binding(no_binding *this)

{
  *(undefined ***)this = &PTR__no_binding_0010fab0;
  std::__cxx11::string::~string((string *)&this->_msg);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~no_binding() throw() { }